

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void SobelXRow_C(uint8 *src_y0,uint8 *src_y1,uint8 *src_y2,uint8 *dst_sobelx,int width)

{
  uint32 v;
  int32 iVar1;
  int sobel;
  int c_diff;
  int b_diff;
  int a_diff;
  int c_sub;
  int b_sub;
  int a_sub;
  int c;
  int b;
  int a;
  int i;
  int width_local;
  uint8 *dst_sobelx_local;
  uint8 *src_y2_local;
  uint8 *src_y1_local;
  uint8 *src_y0_local;
  
  for (b = 0; b < width; b = b + 1) {
    v = libyuv::Abs(((uint)src_y0[b] - (uint)src_y0[b + 2]) +
                    ((uint)src_y1[b] - (uint)src_y1[b + 2]) * 2 +
                    ((uint)src_y2[b] - (uint)src_y2[b + 2]));
    iVar1 = libyuv::clamp255(v);
    dst_sobelx[b] = (uint8)iVar1;
  }
  return;
}

Assistant:

void SobelXRow_C(const uint8* src_y0,
                 const uint8* src_y1,
                 const uint8* src_y2,
                 uint8* dst_sobelx,
                 int width) {
  int i;
  for (i = 0; i < width; ++i) {
    int a = src_y0[i];
    int b = src_y1[i];
    int c = src_y2[i];
    int a_sub = src_y0[i + 2];
    int b_sub = src_y1[i + 2];
    int c_sub = src_y2[i + 2];
    int a_diff = a - a_sub;
    int b_diff = b - b_sub;
    int c_diff = c - c_sub;
    int sobel = Abs(a_diff + b_diff * 2 + c_diff);
    dst_sobelx[i] = (uint8)(clamp255(sobel));
  }
}